

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O1

nng_err nni_http_server_init(nni_http_server **serverp,nng_url *url)

{
  nni_mtx *mtx;
  int iVar1;
  nng_err nVar2;
  nni_http_server *pnVar3;
  char *pcVar4;
  nni_http_server *s;
  nng_url local_100;
  nni_http_server **local_38;
  
  nni_mtx_lock(&http_servers_lk);
  pnVar3 = (nni_http_server *)nni_list_first(&http_servers);
  do {
    if (pnVar3 == (nni_http_server *)0x0) {
      pcVar4 = nni_http_stream_scheme(url->u_scheme);
      pnVar3 = (nni_http_server *)0x0;
      if (pcVar4 == (char *)0x0) {
        nVar2 = NNG_EADDRINVAL;
      }
      else {
        memcpy(&local_100,url,200);
        local_100.u_scheme = pcVar4;
        s = (nni_http_server *)nni_zalloc(0x328);
        nVar2 = NNG_ENOMEM;
        if (s != (nni_http_server *)0x0) {
          local_38 = serverp;
          nni_mtx_init(&s->mtx);
          nni_mtx_init(&s->errors_mtx);
          nni_list_init_offset(&s->handlers,0);
          nni_list_init_offset(&s->conns,0);
          nni_mtx_init(&s->errors_mtx);
          nni_list_init_offset(&s->errors,0);
          nni_aio_init(&s->accaio,http_server_acccb,s);
          s->port = url->u_port;
          pcVar4 = nni_strdup(url->u_hostname);
          s->hostname = pcVar4;
          if (pcVar4 == (char *)0x0) {
            http_server_fini(s);
            serverp = local_38;
          }
          else {
            nVar2 = nng_stream_listener_alloc_url(&s->listener,&local_100);
            serverp = local_38;
            if (nVar2 == NNG_OK) {
              s->refcnt = 1;
              nVar2 = NNG_OK;
              pnVar3 = s;
            }
            else {
              http_server_fini(s);
            }
          }
        }
      }
      if (nVar2 == NNG_OK) {
        nni_list_append(&http_servers,pnVar3);
        *serverp = pnVar3;
      }
LAB_001373b9:
      nni_mtx_unlock(&http_servers_lk);
      return nVar2;
    }
    mtx = &pnVar3->mtx;
    nni_mtx_lock(mtx);
    if (((pnVar3->closed == false) && (url->u_port == pnVar3->port)) &&
       (iVar1 = strcmp(url->u_hostname,pnVar3->hostname), iVar1 == 0)) {
      *serverp = pnVar3;
      pnVar3->refcnt = pnVar3->refcnt + 1;
      nni_mtx_unlock(mtx);
      nVar2 = NNG_OK;
      goto LAB_001373b9;
    }
    nni_mtx_unlock(mtx);
    pnVar3 = (nni_http_server *)nni_list_next(&http_servers,pnVar3);
  } while( true );
}

Assistant:

static nng_err
http_server_init(nni_http_server **serverp, const nng_url *url)
{
	nni_http_server *s;
	nng_err          rv;
	nng_url          my_url;
	const char      *scheme;

	if ((scheme = nni_http_stream_scheme(url->u_scheme)) == NULL) {
		return (NNG_EADDRINVAL);
	}
	// Rewrite URLs to either TLS or TCP.
	memcpy(&my_url, url, sizeof(my_url));
	my_url.u_scheme = (char *) scheme;

	if ((s = NNI_ALLOC_STRUCT(s)) == NULL) {
		return (NNG_ENOMEM);
	}
	nni_mtx_init(&s->mtx);
	nni_mtx_init(&s->errors_mtx);
	NNI_LIST_INIT(&s->handlers, nni_http_handler, node);
	NNI_LIST_INIT(&s->conns, http_sconn, node);

	nni_mtx_init(&s->errors_mtx);
	NNI_LIST_INIT(&s->errors, http_error, node);

	nni_aio_init(&s->accaio, http_server_acccb, s);

	s->port = url->u_port;

	if ((s->hostname = nni_strdup(url->u_hostname)) == NULL) {
		http_server_fini(s);
		return (NNG_ENOMEM);
	}

	if ((rv = nng_stream_listener_alloc_url(&s->listener, &my_url)) != 0) {
		http_server_fini(s);
		return (rv);
	}

	s->refcnt = 1;
	*serverp  = s;
	return (NNG_OK);
}